

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

CVmTimeZone * CVmObjTimeZone::parse_ctor_args(vm_val_t *argp,int argc)

{
  int iVar1;
  char *pcVar2;
  CVmTimeZoneCache *this;
  int in_ESI;
  size_t len;
  CVmTimeZone *tz;
  char *str;
  int32_t in_stack_000000a4;
  CVmTimeZoneCache *in_stack_000000a8;
  CVmTimeZoneCache *in_stack_00000288;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *in_stack_ffffffffffffffd0;
  CVmTimeZone *local_20;
  
  if (in_ESI < 1) {
    local_20 = CVmTimeZoneCache::get_local_zone(in_stack_00000288);
  }
  else if ((in_ESI == 1) &&
          (pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffc8), pcVar2 != (char *)0x0)) {
    this = (CVmTimeZoneCache *)vmb_get_len((char *)0x34b28c);
    local_20 = CVmTimeZoneCache::parse_zone
                         (this,(char *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
  }
  else {
    if ((in_ESI != 1) || (iVar1 = vm_val_t::is_numeric(in_stack_ffffffffffffffd0), iVar1 == 0)) {
      if (in_ESI < 2) {
        err_throw(0);
      }
      err_throw(0);
    }
    vm_val_t::num_to_int((vm_val_t *)G_tzcache_X);
    local_20 = CVmTimeZoneCache::get_gmtofs_zone(in_stack_000000a8,in_stack_000000a4);
  }
  if (local_20 != (CVmTimeZone *)0x0) {
    return local_20;
  }
  err_throw(0);
}

Assistant:

CVmTimeZone *CVmObjTimeZone::parse_ctor_args(
    VMG_ const vm_val_t *argp, int argc)
{
    /* check arguments */
    const char *str;
    CVmTimeZone *tz = 0;
    if (argc <= 0)
    {
        /* no arguments; create a local timezone object */
        tz = G_tzcache->get_local_zone(vmg0_);
    }
    else if (argc == 1 && (str = argp->get_as_string(vmg0_)) != 0)
    {
        /* get the string buffer and length */
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        /* parse the zone name */
        tz = G_tzcache->parse_zone(vmg_ str, len);
    }
    else if (argc == 1 && argp->is_numeric(vmg0_))
    {
        /* construct from a gmt offset */
        tz = G_tzcache->get_gmtofs_zone(vmg_ argp->num_to_int(vmg0_));
    }
    else if (argc > 1)
    {
        /* wrong number of arguments */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }
    else
    {
        /* wrong type */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if we didn't find a zone, it's an error */
    if (tz == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* return the zone */
    return tz;
}